

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

btScalar __thiscall btSoftBody::getTotalMass(btSoftBody *this)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  btScalar bVar5;
  
  uVar2 = (this->m_nodes).m_size;
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  bVar5 = 0.0;
  for (; uVar4 * 0x78 - uVar3 != 0; uVar3 = uVar3 + 0x78) {
    fVar1 = *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + uVar3);
    bVar5 = bVar5 + (float)(-(uint)(0.0 < fVar1) & (uint)(1.0 / fVar1));
  }
  return bVar5;
}

Assistant:

btScalar		btSoftBody::getTotalMass() const
{
	btScalar	mass=0;
	for(int i=0;i<m_nodes.size();++i)
	{
		mass+=getMass(i);
	}
	return(mass);
}